

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeList.c
# Opt level: O3

int FreeListInit(FreeList *free_list,size_t elementSize,int maxFreeListLength)

{
  if (free_list != (FreeList *)0x0) {
    free_list->element_size = elementSize;
    free_list->maxFreeListLength = maxFreeListLength;
    free_list->head = (FreeListNode *)0x0;
    free_list->freeListLength = 0;
    return 0;
  }
  __assert_fail("free_list != NULL",".upnp/src/threadutil/FreeList.c",0x28,
                "int FreeListInit(FreeList *, size_t, int)");
}

Assistant:

int FreeListInit(FreeList *free_list, size_t elementSize, int maxFreeListLength)
{
	assert(free_list != NULL);

	if (free_list == NULL)
		return EINVAL;
	free_list->element_size = elementSize;
	free_list->maxFreeListLength = maxFreeListLength;
	free_list->head = NULL;
	free_list->freeListLength = 0;

	return 0;
}